

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O1

void burstsort_mkq_recursiveburst_2(uchar **strings,size_t N)

{
  iterator __position;
  long lVar1;
  void *pvVar2;
  unsigned_short uVar3;
  uint uVar4;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar5;
  unsigned_short *oracle;
  TSTNode<unsigned_short> *pTVar6;
  sbyte sVar7;
  ulong uVar8;
  ushort uVar9;
  unsigned_short uVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  uint uVar16;
  TSTNode<unsigned_short> *pTVar17;
  uchar *str;
  TSTNode<unsigned_short> root;
  BurstRecursive<unsigned_short> local_81;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *local_80;
  uchar **local_78;
  uchar *local_70;
  size_t local_68;
  size_t local_60;
  TSTNode<unsigned_short> local_58;
  
  local_58.buckets._M_elems[2] = (void *)0x0;
  local_58.is_tst.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  local_58.buckets._M_elems[0] = (void *)0x0;
  local_58.buckets._M_elems[1] = (void *)0x0;
  uVar3 = pseudo_median<unsigned_short>(strings,N,0);
  local_58.pivot = uVar3;
  local_60 = N;
  if (N != 0) {
    sVar14 = 0;
    local_78 = strings;
    do {
      local_70 = strings[sVar14];
      if (local_70 == (uchar *)0x0) {
LAB_00213ade:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (*local_70 == '\0') {
        uVar9 = 0;
      }
      else {
        uVar9 = CONCAT11(*local_70,local_70[1]);
      }
      uVar16 = (uint)(uVar9 == uVar3) + (uint)(uVar3 < uVar9) * 2;
      sVar7 = (sbyte)uVar16;
      pTVar17 = &local_58;
      sVar11 = 0;
      uVar4 = (uint)local_58.is_tst.super__Base_bitset<1UL>._M_w;
      while( true ) {
        if ((uVar4 >> uVar16 & 1) == 0) break;
        sVar12 = sVar11;
        if (uVar16 == 1) {
          sVar12 = sVar11 + 2;
          if (local_70[sVar11 + 2] == '\0') {
            uVar9 = 0;
          }
          else {
            uVar9 = CONCAT11(local_70[sVar11 + 2],local_70[sVar11 + 3]);
          }
        }
        pTVar17 = (TSTNode<unsigned_short> *)(pTVar17->buckets)._M_elems[uVar16];
        uVar16 = (uint)(uVar9 == pTVar17->pivot) + (uint)(pTVar17->pivot < uVar9) * 2;
        uVar4 = (uint)(pTVar17->is_tst).super__Base_bitset<1UL>._M_w;
        sVar7 = (sbyte)uVar16;
        sVar11 = sVar12;
      }
      pvVar5 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
               (pTVar17->buckets)._M_elems[uVar16];
      if (pvVar5 == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
        pvVar5 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
        *(undefined8 *)pvVar5 = 0;
        *(undefined8 *)(pvVar5 + 8) = 0;
        *(undefined8 *)(pvVar5 + 0x10) = 0;
        (pTVar17->buckets)._M_elems[uVar16] = pvVar5;
      }
      __position._M_current = *(uchar ***)(pvVar5 + 8);
      if (__position._M_current == *(uchar ***)(pvVar5 + 0x10)) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(pvVar5,__position,&local_70);
        strings = local_78;
      }
      else {
        *__position._M_current = local_70;
        *(long *)(pvVar5 + 8) = *(long *)(pvVar5 + 8) + 8;
      }
      if ((uVar16 != 1) || ((char)pTVar17->pivot != '\0')) {
        lVar1 = *(long *)pvVar5;
        lVar13 = *(long *)(pvVar5 + 8) - lVar1;
        uVar15 = lVar13 >> 3;
        if ((0x4000 < uVar15) && (*(long *)(pvVar5 + 8) == *(long *)(pvVar5 + 0x10))) {
          sVar12 = sVar11 + 2;
          if (uVar16 != 1) {
            sVar12 = sVar11;
          }
          local_80 = pvVar5;
          local_68 = sVar14;
          oracle = (unsigned_short *)malloc(lVar13 >> 2);
          uVar4 = 1;
          uVar8 = 0;
          do {
            lVar13 = *(long *)(lVar1 + uVar8 * 8);
            if (lVar13 == 0) goto LAB_00213ade;
            if (*(char *)(lVar13 + sVar12) == '\0') {
              uVar10 = 0;
            }
            else {
              uVar10 = CONCAT11(*(char *)(lVar13 + sVar12),*(undefined1 *)(lVar13 + 1 + sVar12));
            }
            oracle[uVar8] = uVar10;
            uVar8 = (ulong)uVar4;
            uVar4 = uVar4 + 1;
          } while (uVar8 < uVar15);
          verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                    (&local_58,0);
          pvVar5 = local_80;
          pTVar6 = BurstRecursive<unsigned_short>::operator()
                             (&local_81,
                              (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)local_80,
                              oracle,sVar12);
          free(oracle);
          pvVar2 = *(void **)pvVar5;
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2);
            pvVar5 = local_80;
          }
          operator_delete(pvVar5);
          (pTVar17->buckets)._M_elems[uVar16] = pTVar6;
          (pTVar17->is_tst).super__Base_bitset<1UL>._M_w =
               (pTVar17->is_tst).super__Base_bitset<1UL>._M_w | 1L << sVar7;
          verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                    (&local_58,0);
          sVar14 = local_68;
          strings = local_78;
        }
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 != local_60);
  }
  verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>(&local_58,0)
  ;
  burst_traverse<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
            (&local_58,strings,0,0);
  return;
}

Assistant:

void burstsort_mkq_recursiveburst_2(unsigned char** strings, size_t N)
{ burstsort_mkq_recursiveburst<uint16_t>(strings, N); }